

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parquet.cpp
# Opt level: O1

shared_ptr<duckdb::ParquetEncryptionConfig,_true> __thiscall
duckdb::ParquetEncryptionConfig::Deserialize
          (ParquetEncryptionConfig *this,Deserializer *deserializer)

{
  uint uVar1;
  ParquetEncryptionConfig *pPVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ParquetEncryptionConfig,_true> sVar3;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  pPVar2 = (ParquetEncryptionConfig *)operator_new(0x58);
  ParquetEncryptionConfig(pPVar2);
  (this->footer_key)._M_dataplus._M_p = (pointer)pPVar2;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ParquetEncryptionConfig*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->footer_key)._M_string_length,
             pPVar2);
  pPVar2 = shared_ptr<duckdb::ParquetEncryptionConfig,_true>::operator->
                     ((shared_ptr<duckdb::ParquetEncryptionConfig,_true> *)this);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"footer_key");
  if ((char)uVar1 == '\0') {
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)pPVar2,(string *)&local_50);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)pPVar2,(string *)&local_50);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  pPVar2 = shared_ptr<duckdb::ParquetEncryptionConfig,_true>::operator->
                     ((shared_ptr<duckdb::ParquetEncryptionConfig,_true> *)this);
  Deserializer::
  ReadPropertyWithDefault<std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
            (deserializer,0x65,"column_keys",&pPVar2->column_keys);
  sVar3.internal.super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this;
  return (shared_ptr<duckdb::ParquetEncryptionConfig,_true>)
         sVar3.internal.
         super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ParquetEncryptionConfig> ParquetEncryptionConfig::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::shared_ptr<ParquetEncryptionConfig>(new ParquetEncryptionConfig());
	deserializer.ReadPropertyWithDefault<string>(100, "footer_key", result->footer_key);
	deserializer.ReadPropertyWithDefault<unordered_map<string, string>>(101, "column_keys", result->column_keys);
	return result;
}